

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

bool __thiscall QGraphicsObject::event(QGraphicsObject *this,QEvent *ev)

{
  undefined1 uVar1;
  long in_FS_OFFSET;
  QRectF local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(short *)(ev + 8) == 0xd5) {
    if ((*(byte *)(*(long *)(this + 0x18) + 0x160) & 0x20) != 0) {
      ev[0xc] = (QEvent)0x1;
      local_28.w = 0.0;
      local_28.h = 0.0;
      local_28.xp = 0.0;
      local_28.yp = 0.0;
      QGraphicsItem::update((QGraphicsItem *)(this + 0x10),&local_28);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return true;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    uVar1 = QObject::event((QEvent *)this);
    return (bool)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QGraphicsObject::event(QEvent *ev)
{
    if (ev->type() == QEvent::StyleAnimationUpdate) {
        if (isVisible()) {
            ev->accept();
            update();
        }
        return true;
    }
    return QObject::event(ev);
}